

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list_column_data.cpp
# Opt level: O0

void __thiscall
duckdb::ListColumnData::InitializeAppend(ListColumnData *this,ColumnAppendState *state)

{
  pointer __x;
  ColumnAppendState *in_RDI;
  ColumnAppendState child_append_state;
  ColumnAppendState validity_append_state;
  value_type *in_stack_ffffffffffffff68;
  undefined1 local_80 [88];
  ColumnAppendState *in_stack_ffffffffffffffd8;
  ColumnData *in_stack_ffffffffffffffe0;
  
  ColumnData::InitializeAppend(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  ColumnAppendState::ColumnAppendState(in_RDI);
  ColumnData::InitializeAppend(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  ::std::vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>::push_back
            ((vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_> *)in_RDI
             ,in_stack_ffffffffffffff68);
  ColumnAppendState::ColumnAppendState(in_RDI);
  __x = unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true>::operator->
                  ((unique_ptr<duckdb::ColumnData,_std::default_delete<duckdb::ColumnData>,_true> *)
                   in_RDI);
  (*__x->_vptr_ColumnData[0x11])(__x,local_80);
  ::std::vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_>::push_back
            ((vector<duckdb::ColumnAppendState,_std::allocator<duckdb::ColumnAppendState>_> *)in_RDI
             ,(value_type *)__x);
  ColumnAppendState::~ColumnAppendState(in_RDI);
  ColumnAppendState::~ColumnAppendState(in_RDI);
  return;
}

Assistant:

void ListColumnData::InitializeAppend(ColumnAppendState &state) {
	// initialize the list offset append
	ColumnData::InitializeAppend(state);

	// initialize the validity append
	ColumnAppendState validity_append_state;
	validity.InitializeAppend(validity_append_state);
	state.child_appends.push_back(std::move(validity_append_state));

	// initialize the child column append
	ColumnAppendState child_append_state;
	child_column->InitializeAppend(child_append_state);
	state.child_appends.push_back(std::move(child_append_state));
}